

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Regex.cpp
# Opt level: O0

void __thiscall Regex::backtrackGroups(Regex *this,ParseData *data)

{
  int iVar1;
  uint uVar2;
  GroupData *pGVar3;
  long lVar4;
  GroupData *pGVar5;
  string *s;
  int i;
  ParseData *data_local;
  Regex *this_local;
  
  s._4_4_ = 0;
  while( true ) {
    uVar2 = JetHead::vector<Regex::GroupData>::size(&this->mGroups);
    if ((int)uVar2 <= (int)s._4_4_) break;
    pGVar3 = JetHead::vector<Regex::GroupData>::operator[](&this->mGroups,s._4_4_);
    if (data->cur_pos < pGVar3->end_pos) {
      pGVar3 = JetHead::vector<Regex::GroupData>::operator[](&this->mGroups,s._4_4_);
      lVar4 = std::__cxx11::string::length();
      pGVar5 = JetHead::vector<Regex::GroupData>::operator[](&this->mGroups,s._4_4_);
      std::__cxx11::string::erase((ulong)&pGVar3->string,lVar4 - (pGVar5->end_pos - data->cur_pos));
      iVar1 = data->cur_pos;
      pGVar3 = JetHead::vector<Regex::GroupData>::operator[](&this->mGroups,s._4_4_);
      pGVar3->end_pos = iVar1;
    }
    s._4_4_ = s._4_4_ + 1;
  }
  return;
}

Assistant:

void	Regex::backtrackGroups( ParseData *data )
{
	for ( int i = 0; i < (int)mGroups.size(); i++ )
	{
		if ( mGroups[ i ].end_pos > data->cur_pos )
		{
			std::string &s = mGroups[ i ].string;
			s.erase( s.length() - ( mGroups[ i ].end_pos - data->cur_pos ) );
			mGroups[ i ].end_pos = data->cur_pos;
		}
	}
}